

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O1

void __thiscall
QGraphicsScenePrivate::registerTopLevelItem(QGraphicsScenePrivate *this,QGraphicsItem *item)

{
  qsizetype i;
  long in_FS_OFFSET;
  QGraphicsItem *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  ensureSequentialTopLevelSiblingIndexes(this);
  this->field_0xb8 = this->field_0xb8 | 0x20;
  i = (this->topLevelItems).d.size;
  ((item->d_ptr).d)->siblingIndex = (int)i;
  local_20 = item;
  QtPrivate::QPodArrayOps<QGraphicsItem*>::emplace<QGraphicsItem*&>
            ((QPodArrayOps<QGraphicsItem*> *)&this->topLevelItems,i,&local_20);
  QList<QGraphicsItem_*>::end(&this->topLevelItems);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsScenePrivate::registerTopLevelItem(QGraphicsItem *item)
{
    ensureSequentialTopLevelSiblingIndexes();
    needSortTopLevelItems = true; // ### maybe false
    item->d_ptr->siblingIndex = topLevelItems.size();
    topLevelItems.append(item);
}